

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_calc.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  double dVar4;
  allocator local_2a1;
  string local_2a0 [32];
  any local_280;
  string local_258 [8];
  string line;
  undefined1 local_238 [8];
  CalcReader reader;
  
  reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  anon_unknown.dwarf_6faf::CalcReader::CalcReader((CalcReader *)local_238);
  std::__cxx11::string::string(local_258);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,local_258);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"input",&local_2a1);
    Omega_h::Reader::read_string((string *)&local_280,(string *)local_238);
    dVar4 = Omega_h::any_cast<double>(&local_280);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar4);
    std::operator<<(poVar3,'\n');
    Omega_h::any::~any(&local_280);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  }
  std::__cxx11::string::~string(local_258);
  anon_unknown.dwarf_6faf::CalcReader::~CalcReader((CalcReader *)local_238);
  return reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main() {
  CalcReader reader;
  for (std::string line; std::getline(std::cin, line);) {
    std::cout << Omega_h::any_cast<double>(reader.read_string("input", line))
              << '\n';
  }
}